

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

int unqlite_kv_fetch(unqlite *pDb,void *pKey,int nKeyLen,void *pBuf,unqlite_int64 *pBufLen)

{
  unqlite_kv_cursor *puVar1;
  unqlite_kv_methods *puVar2;
  char *pcVar3;
  int iVar4;
  char *pcVar5;
  SyBlob sBlob;
  SyMemBackend *local_50;
  void *local_48;
  undefined8 uStack_40;
  uint local_38;
  
  iVar4 = -0x18;
  if ((pDb != (unqlite *)0x0) && (pDb->nMagic == 0xdb7c2712)) {
    if (nKeyLen < 0) {
      pcVar5 = (char *)pKey;
      if (*pKey != '\0') {
        pcVar3 = (char *)((long)pKey + 2);
        do {
          pcVar5 = pcVar3;
          if (pcVar5[-1] == '\0') {
            pcVar5 = pcVar5 + -1;
            goto LAB_0010ddd3;
          }
          if (*pcVar5 == '\0') goto LAB_0010ddd3;
          if (pcVar5[1] == '\0') {
            pcVar5 = pcVar5 + 1;
            goto LAB_0010ddd3;
          }
          pcVar3 = pcVar5 + 4;
        } while (pcVar5[2] != '\0');
        pcVar5 = pcVar5 + 2;
      }
LAB_0010ddd3:
      nKeyLen = (int)pcVar5 - (int)pKey;
    }
    puVar1 = (pDb->sDB).pCursor;
    puVar2 = ((pDb->sDB).pPager)->pEngine->pIo->pMethods;
    if (nKeyLen == 0) {
      unqliteGenError(pDb,"Empty key");
      iVar4 = -3;
    }
    else {
      iVar4 = (*puVar2->xSeek)(puVar1,pKey,nKeyLen,1);
    }
    if (iVar4 == 0) {
      if (pBuf == (void *)0x0) {
        iVar4 = (*puVar2->xDataLength)(puVar1,pBufLen);
        return iVar4;
      }
      uStack_40 = (ulong)(uint)*pBufLen << 0x20;
      local_50 = (SyMemBackend *)0x0;
      local_38 = 3;
      local_48 = pBuf;
      iVar4 = (*puVar2->xData)(puVar1,unqliteDataConsumer,&local_50);
      *pBufLen = uStack_40 & 0xffffffff;
      if (((local_38 & 6) == 0) && (uStack_40._4_4_ != 0)) {
        SyMemBackendFree(local_50,local_48);
      }
    }
  }
  return iVar4;
}

Assistant:

int unqlite_kv_fetch(unqlite *pDb,const void *pKey,int nKeyLen,void *pBuf,unqlite_int64 *pBufLen)
{
	unqlite_kv_methods *pMethods;
	unqlite_kv_engine *pEngine;
	unqlite_kv_cursor *pCur;
	int rc;
	if( UNQLITE_DB_MISUSE(pDb) ){
		return UNQLITE_CORRUPT;
	}
#if defined(UNQLITE_ENABLE_THREADS)
	 /* Acquire DB mutex */
	 SyMutexEnter(sUnqlMPGlobal.pMutexMethods, pDb->pMutex); /* NO-OP if sUnqlMPGlobal.nThreadingLevel != UNQLITE_THREAD_LEVEL_MULTI */
	 if( sUnqlMPGlobal.nThreadingLevel > UNQLITE_THREAD_LEVEL_SINGLE && 
		 UNQLITE_THRD_DB_RELEASE(pDb) ){
			 return UNQLITE_ABORT; /* Another thread have released this instance */
	 }
#endif
	 /* Point to the underlying storage engine */
	 pEngine = unqlitePagerGetKvEngine(pDb);
	 pMethods = pEngine->pIo->pMethods;
	 pCur = pDb->sDB.pCursor;
	 if( nKeyLen < 0 ){
		 /* Assume a null terminated string and compute it's length */
		 nKeyLen = SyStrlen((const char *)pKey);
	 }
	 if( !nKeyLen ){
		  unqliteGenError(pDb,"Empty key");
		  rc = UNQLITE_EMPTY;
	 }else{
		  /* Seek to the record position */
		  rc = pMethods->xSeek(pCur,pKey,nKeyLen,UNQLITE_CURSOR_MATCH_EXACT);
	 }
	 if( rc == UNQLITE_OK ){
		 if( pBuf == 0 ){
			 /* Data length only */
			 rc = pMethods->xDataLength(pCur,pBufLen);
		 }else{
			 SyBlob sBlob;
			 /* Initialize the data consumer */
			 SyBlobInitFromBuf(&sBlob,pBuf,(sxu32)*pBufLen);
			 /* Consume the data */
			 rc = pMethods->xData(pCur,unqliteDataConsumer,&sBlob);
			 /* Data length */
			 *pBufLen = (unqlite_int64)SyBlobLength(&sBlob);
			 /* Cleanup */
			 SyBlobRelease(&sBlob);
		 }
	 }
#if defined(UNQLITE_ENABLE_THREADS)
	 /* Leave DB mutex */
	 SyMutexLeave(sUnqlMPGlobal.pMutexMethods,pDb->pMutex); /* NO-OP if sUnqlMPGlobal.nThreadingLevel != UNQLITE_THREAD_LEVEL_MULTI */
#endif
	return rc;
}